

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O0

void issue208b(void)

{
  int iVar1;
  roaring_bitmap_t *bm;
  uint64_t uVar2;
  uint32_t rank;
  uint32_t expected;
  uint32_t i_2;
  uint32_t i_1;
  uint32_t i;
  roaring_bitmap_t *r;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  uint uVar3;
  uint uVar4;
  uint x;
  
  bm = roaring_bitmap_create();
  for (x = 0xffc0; x < 0x10000; x = x + 1) {
    roaring_bitmap_add(r,i);
  }
  for (uVar4 = 0; uVar4 < 0x2004; uVar4 = uVar4 + 2) {
    roaring_bitmap_add(r,i);
  }
  for (uVar3 = 0xffc0; uVar3 < 0x10000; uVar3 = uVar3 + 1) {
    iVar1 = uVar3 - 0xefbd;
    uVar2 = roaring_bitmap_rank(bm,x);
    _assert_true(CONCAT44(x,uVar4),(char *)CONCAT44(uVar3,iVar1),
                 (char *)CONCAT44((int)uVar2,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc);
  }
  roaring_bitmap_free((roaring_bitmap_t *)0x10c313);
  return;
}

Assistant:

DEFINE_TEST(issue208b) {
    roaring_bitmap_t *r = roaring_bitmap_create();
    for (uint32_t i = 65536 - 64; i < 65536; i++) {
        roaring_bitmap_add(r, i);
    }
    for (uint32_t i = 0; i < 8196; i += 2) {
        roaring_bitmap_add(r, i);
    }
    for (uint32_t i = 65536 - 64; i < 65536; i++) {
        uint32_t expected = i - (65536 - 64) + 8196 / 2 + 1;
        uint32_t rank = roaring_bitmap_rank(r, i);
        assert_true(rank == expected);
    }
    roaring_bitmap_free(r);
}